

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

Nonnull<const_std::string_*> absl::lts_20250127::Status::MovedFromString_abi_cxx11_(void)

{
  int iVar1;
  
  if (MovedFromString[abi:cxx11]()::kMovedFrom_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&MovedFromString[abi:cxx11]()::kMovedFrom_abi_cxx11_);
    if (iVar1 != 0) {
      NoDestructor<std::__cxx11::string>::PlacementImpl::PlacementImpl<char_const(&)[28]>
                ((PlacementImpl *)&MovedFromString[abi:cxx11]()::kMovedFrom_abi_cxx11_,
                 (char (*) [28])"Status accessed after move.");
      __cxa_guard_release(&MovedFromString[abi:cxx11]()::kMovedFrom_abi_cxx11_);
    }
  }
  return (Nonnull<const_std::string_*>)&MovedFromString[abi:cxx11]()::kMovedFrom_abi_cxx11_;
}

Assistant:

absl::Nonnull<const std::string*> Status::MovedFromString() {
  static const absl::NoDestructor<std::string> kMovedFrom(kMovedFromString);
  return kMovedFrom.get();
}